

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::multiplicativeInverse(APInt *this,APInt *modulo)

{
  bool bVar1;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  long lVar2;
  APInt *pAVar3;
  ulong uVar4;
  ulong uVar5;
  APInt AVar6;
  APInt t [2];
  APInt r [2];
  APInt q;
  APInt local_40;
  
  bVar1 = ult(modulo,in_RDX);
  if (bVar1) {
    APInt(r,in_RDX);
    APInt(r + 1,modulo);
    APInt(t,modulo->BitWidth,0,false);
    APInt(t + 1,modulo->BitWidth,1,false);
    APInt(&q,modulo->BitWidth,0,false);
    uVar4 = 0;
    while( true ) {
      uVar5 = (ulong)((uint)uVar4 ^ 1);
      bVar1 = operator!=(r + uVar5,0);
      pAVar3 = r + uVar4;
      if (!bVar1) break;
      udivrem(pAVar3,r + uVar5,&q,pAVar3);
      operator*(&local_40,t + uVar5);
      operator-=(t + uVar4,&local_40);
      ~APInt(&local_40);
      uVar4 = uVar5;
    }
    bVar1 = operator!=(pAVar3,1);
    if (bVar1) {
      APInt(this,modulo->BitWidth,0,false);
    }
    else {
      pAVar3 = t + uVar4;
      bVar1 = isNegative(pAVar3);
      if (bVar1) {
        operator+=(pAVar3,in_RDX);
      }
      this->BitWidth = t[uVar4].BitWidth;
      this->U = pAVar3->U;
      t[uVar4].BitWidth = 0;
    }
    ~APInt(&q);
    lVar2 = 0x10;
    do {
      ~APInt((APInt *)((long)&t[0].U + lVar2));
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != -0x10);
    lVar2 = 0x10;
    do {
      ~APInt((APInt *)((long)&r[0].U + lVar2));
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != -0x10);
    AVar6._8_8_ = extraout_RDX;
    AVar6.U.pVal = (uint64_t *)this;
    return AVar6;
  }
  __assert_fail("ult(modulo) && \"This APInt must be smaller than the modulo\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x452,"APInt llvm::APInt::multiplicativeInverse(const APInt &) const");
}

Assistant:

APInt APInt::multiplicativeInverse(const APInt& modulo) const {
  assert(ult(modulo) && "This APInt must be smaller than the modulo");

  // Using the properties listed at the following web page (accessed 06/21/08):
  //   http://www.numbertheory.org/php/euclid.html
  // (especially the properties numbered 3, 4 and 9) it can be proved that
  // BitWidth bits suffice for all the computations in the algorithm implemented
  // below. More precisely, this number of bits suffice if the multiplicative
  // inverse exists, but may not suffice for the general extended Euclidean
  // algorithm.

  APInt r[2] = { modulo, *this };
  APInt t[2] = { APInt(BitWidth, 0), APInt(BitWidth, 1) };
  APInt q(BitWidth, 0);

  unsigned i;
  for (i = 0; r[i^1] != 0; i ^= 1) {
    // An overview of the math without the confusing bit-flipping:
    // q = r[i-2] / r[i-1]
    // r[i] = r[i-2] % r[i-1]
    // t[i] = t[i-2] - t[i-1] * q
    udivrem(r[i], r[i^1], q, r[i]);
    t[i] -= t[i^1] * q;
  }

  // If this APInt and the modulo are not coprime, there is no multiplicative
  // inverse, so return 0. We check this by looking at the next-to-last
  // remainder, which is the gcd(*this,modulo) as calculated by the Euclidean
  // algorithm.
  if (r[i] != 1)
    return APInt(BitWidth, 0);

  // The next-to-last t is the multiplicative inverse.  However, we are
  // interested in a positive inverse. Calculate a positive one from a negative
  // one if necessary. A simple addition of the modulo suffices because
  // abs(t[i]) is known to be less than *this/2 (see the link above).
  if (t[i].isNegative())
    t[i] += modulo;

  return std::move(t[i]);
}